

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agsmock.cpp
# Opt level: O0

void __thiscall AGSMock::GameAborted::GameAborted(GameAborted *this,char *reason)

{
  allocator<char> local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  char *local_18;
  char *reason_local;
  GameAborted *this_local;
  
  local_18 = reason;
  reason_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"Plugin called \'AbortGame\': ",&local_59);
  std::operator+(&local_38,&local_58,local_18);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  *(undefined ***)this = &PTR__GameAborted_0011f680;
  return;
}

Assistant:

GameAborted::GameAborted(const char *reason)
	: runtime_error(string("Plugin called 'AbortGame': ") + reason) {}